

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O0

QAbstractItemDelegate * __thiscall
QAbstractItemViewPrivate::delegateForIndex(QAbstractItemViewPrivate *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  QModelIndex *in_RSI;
  QMap<int,_QPointer<QAbstractItemDelegate>_> *in_RDI;
  long in_FS_OFFSET;
  ConstIterator it;
  const_iterator *in_stack_ffffffffffffff88;
  const_iterator *in_stack_ffffffffffffff90;
  QMap<int,_QPointer<QAbstractItemDelegate>_> *lhs;
  QMap<int,_QPointer<QAbstractItemDelegate>_> *key;
  QAbstractItemDelegate *local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::const_iterator
            ((const_iterator *)0x816e60);
  key = in_RDI + 0x62;
  QModelIndex::row(in_RSI);
  QMap<int,_QPointer<QAbstractItemDelegate>_>::find(in_RDI,(int *)key);
  QMap<int,_QPointer<QAbstractItemDelegate>_>::end(in_RDI);
  bVar2 = ::operator!=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar2) {
    QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::value((const_iterator *)0x816ed1);
    local_48 = ::QPointer::operator_cast_to_QAbstractItemDelegate_
                         ((QPointer<QAbstractItemDelegate> *)0x816ed9);
  }
  else {
    lhs = in_RDI + 99;
    QModelIndex::column(in_RSI);
    QMap<int,_QPointer<QAbstractItemDelegate>_>::find(in_RDI,(int *)key);
    QMap<int,_QPointer<QAbstractItemDelegate>_>::end(in_RDI);
    bVar2 = ::operator!=((const_iterator *)lhs,in_stack_ffffffffffffff88);
    if (bVar2) {
      QMap<int,_QPointer<QAbstractItemDelegate>_>::const_iterator::value((const_iterator *)0x816f54)
      ;
      local_48 = ::QPointer::operator_cast_to_QAbstractItemDelegate_
                           ((QPointer<QAbstractItemDelegate> *)0x816f5c);
    }
    else {
      local_48 = ::QPointer::operator_cast_to_QAbstractItemDelegate_
                           ((QPointer<QAbstractItemDelegate> *)0x816f74);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

inline QAbstractItemDelegate *delegateForIndex(const QModelIndex &index) const {
        QMap<int, QPointer<QAbstractItemDelegate> >::ConstIterator it;

        it = rowDelegates.find(index.row());
        if (it != rowDelegates.end())
            return it.value();

        it = columnDelegates.find(index.column());
        if (it != columnDelegates.end())
            return it.value();

        return itemDelegate;
    }